

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O3

void lsvm::hashmap::print(hashmap *h)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  hashbucket *b;
  ulong uVar4;
  equals_fp p_Var5;
  bool bVar6;
  float local_48;
  float local_44;
  
  printf("hashmap: [count:%d][partitions:%d/%d][max_depth:%d][new_bucket_size:%d,range=%d,avg_bucket_size:%d]\npartitions: ["
         ,(ulong)h->count,(ulong)h->bits,(ulong)h->max_bits,(ulong)h->max_depth,
         (ulong)(uint)(&primes)[h->new_bucket_indx],(ulong)h->range,
         (ulong)(uint)(&primes)[h->avg_bucket_indx]);
  uVar1 = h->bits;
  uVar4 = 0;
  do {
    printf(" %d:%p ",uVar4 & 0xffffffff,(&h[1].equals)[uVar4]);
    uVar4 = uVar4 + 1;
  } while ((ulong)uVar1 + 1 != uVar4);
  puts("]");
  local_48 = 0.0;
  local_44 = 0.0;
  uVar3 = 0;
  uVar4 = 0;
  do {
    p_Var5 = (&h[1].equals)[uVar4];
    if (p_Var5 != (equals_fp)0x0) {
      uVar2 = 0;
      printf("%d: %p - ",uVar4 & 0xffffffff,p_Var5);
      do {
        local_44 = local_44 +
                   (float)*(uint *)(p_Var5 + 8) / (float)(uint)(&primes)[*(uint *)(p_Var5 + 0xc)];
        local_48 = local_48 + 1.0;
        printf("[count:%d,bucket_size:%d,load_factor=%.2f] ",
               (double)((float)*(uint *)(p_Var5 + 8) /
                       (float)(uint)(&primes)[*(uint *)(p_Var5 + 0xc)]));
        uVar3 = (uVar3 + (&primes)[*(uint *)(p_Var5 + 0xc)]) - *(int *)(p_Var5 + 8);
        uVar2 = uVar2 + *(int *)(p_Var5 + 8);
        p_Var5 = *(equals_fp *)p_Var5;
      } while (p_Var5 != (equals_fp)0x0);
      printf("[sum_count=%d]\n",(ulong)uVar2);
    }
    bVar6 = uVar4 != uVar1;
    uVar4 = uVar4 + 1;
  } while (bVar6);
  uVar2 = h->count;
  printf("count=%d, empty=%d, load_factor=%.2f, avg_load_factor=%.2f\n",
         (double)((float)uVar2 / (float)(uVar2 + uVar3)),(double)(local_44 / local_48),(ulong)uVar2,
         (ulong)uVar3);
  return;
}

Assistant:

void print(hashmap* h){
    printf("hashmap: [count:%d][partitions:%d/%d][max_depth:%d][new_bucket_size:%d,range=%d,avg_bucket_size:%d]\npartitions: [",h->count, h->bits,h->max_bits, h->max_depth, primes[h->new_bucket_indx],h->range,primes[h->avg_bucket_indx]);
    
    uint32_t max_partitions = partition_count(h->bits);
    hashbucket** bp = buckets(h);
    uint32_t i = 0;
    while(i < max_partitions){
        printf(" %d:%p ",i,bp[i]);
        ++i;
    }
    printf("]\n");

    i = 0;
    uint32_t e = 0;
    float lf_sum = 0.0f; float lf_sumi = 0;
    while(i < max_partitions){
        if(bp[i] != null){
            hashbucket* b = bp[i];
            printf("%d: %p - ",i,b);
            uint32_t sum_count = 0;
            while(b != null){
                float lf = ((float)b->count)/bucket_size(b);
                lf_sum  += lf; lf_sumi += 1;
                printf("[count:%d,bucket_size:%d,load_factor=%.2f] ",b->count,bucket_size(b),lf);
                e += bucket_size(b)-b->count;
                sum_count += b->count;
                b = b->next;
            }
        
            printf("[sum_count=%d]\n",sum_count);
        }
        ++i;
    }
    printf("count=%d, empty=%d, load_factor=%.2f, avg_load_factor=%.2f\n",h->count,e,((float)h->count)/(e+h->count),lf_sum/lf_sumi);
}